

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O0

exp_number
ising::free_energy::square::transfer_matrix<double>::product_U
          (uint_t Ly,real_t Jx,real_t beta,exp_number *factor,
          vector<double,_std::allocator<double>_> *v,vector<double,_std::allocator<double>_> *v_10,
          vector<double,_std::allocator<double>_> *v_20,
          vector<double,_std::allocator<double>_> *v_01,
          vector<double,_std::allocator<double>_> *v_02,vector<double,_std::allocator<double>_> *vt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  reference pdVar12;
  ulong uVar13;
  reference pvVar14;
  byte bVar15;
  vector<double,_std::allocator<double>_> *in_RCX;
  ulong in_RSI;
  undefined8 in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  double in_XMM0_Qa;
  double dVar16;
  double dVar17;
  double dVar18;
  exp_number<double> *peVar19;
  double in_XMM1_Qa;
  exp_number<double> eVar20;
  exp_number eVar21;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  uint_t c_1;
  real_t norm_inv;
  uint_t c;
  real_t norm2;
  uint_t c1_4;
  uint_t c0_4;
  uint_t c1_3;
  uint_t c0_3;
  uint_t c1_2;
  uint_t c0_2;
  uint_t c1_1;
  uint_t c0_1;
  uint_t c1;
  uint_t c0;
  uint_t s;
  array<double,_2UL> weight;
  uint_t dim;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdb8;
  exp_number<double> *in_stack_fffffffffffffdc0;
  exp_number<double> *in_stack_fffffffffffffdc8;
  ulong local_d0;
  ulong local_c0;
  double local_b8;
  ulong local_a8;
  ulong local_98;
  ulong local_88;
  ulong local_78;
  ulong local_68;
  ulong local_60;
  array<double,_2UL> local_58;
  ulong local_48;
  vector<double,_std::allocator<double>_> *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  vector<double,_std::allocator<double>_> *local_30;
  double local_20;
  double local_18;
  ulong local_10;
  
  local_48 = (ulong)(1 << ((byte)in_RSI & 0x1f));
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_20 = in_XMM1_Qa;
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  dVar16 = exp(in_XMM1_Qa * in_XMM0_Qa);
  pdVar12 = boost::array<double,_2UL>::operator[](&local_58,0);
  *pdVar12 = dVar16;
  dVar16 = exp(-local_20 * local_18);
  pdVar12 = boost::array<double,_2UL>::operator[](&local_58,1);
  *pdVar12 = dVar16;
  for (local_60 = 0; local_60 < local_10; local_60 = local_60 + 1) {
    for (local_68 = 0; bVar15 = (byte)local_60, local_68 < local_48; local_68 = local_68 + 1) {
      uVar13 = local_68 ^ (long)(1 << (bVar15 & 0x1f));
      dVar17 = local_18 * local_18;
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,0);
      dVar16 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_30,local_68);
      dVar1 = *pvVar14;
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,1);
      dVar2 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_30,uVar13);
      dVar3 = *pvVar14;
      dVar18 = local_18 * 2.0;
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,0);
      dVar4 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_38,local_68);
      dVar5 = *pvVar14;
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,1);
      dVar6 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_38,uVar13);
      dVar7 = *pvVar14;
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,0);
      dVar8 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_40,local_68);
      dVar9 = *pvVar14;
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,1);
      dVar10 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_40,uVar13);
      dVar11 = *pvVar14;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000018,local_68)
      ;
      *pvVar14 = dVar17 * (dVar16 * dVar1 + dVar2 * dVar3) +
                 dVar18 * (dVar4 * dVar5 + -(dVar6 * dVar7)) + dVar8 * dVar9 + dVar10 * dVar11;
    }
    std::swap<double,std::allocator<double>>
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
    for (local_78 = 0; dVar16 = local_18, local_78 < local_48; local_78 = local_78 + 1) {
      uVar13 = local_78 ^ (long)(1 << (bVar15 & 0x1f));
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,0);
      dVar1 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_30,local_78);
      dVar2 = *pvVar14;
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,1);
      dVar3 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_30,uVar13);
      dVar4 = *pvVar14;
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,0);
      dVar5 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_38,local_78);
      dVar6 = *pvVar14;
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,1);
      dVar7 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_38,uVar13);
      dVar8 = *pvVar14;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000018,local_78)
      ;
      *pvVar14 = dVar16 * (dVar1 * dVar2 + -(dVar3 * dVar4)) + dVar5 * dVar6 + dVar7 * dVar8;
    }
    std::swap<double,std::allocator<double>>
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
    for (local_88 = 0; local_88 < local_48; local_88 = local_88 + 1) {
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,0);
      dVar16 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000010,local_88)
      ;
      dVar1 = *pvVar14;
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,1);
      dVar2 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                          (in_stack_00000010,local_88 ^ (long)(1 << (bVar15 & 0x1f)));
      dVar3 = *pvVar14;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000018,local_88)
      ;
      *pvVar14 = dVar16 * dVar1 + dVar2 * dVar3;
    }
    std::swap<double,std::allocator<double>>
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
    for (local_98 = 0; local_98 < local_48; local_98 = local_98 + 1) {
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,0);
      dVar16 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000008,local_98)
      ;
      dVar1 = *pvVar14;
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,1);
      dVar2 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                          (in_stack_00000008,local_98 ^ (long)(1 << (bVar15 & 0x1f)));
      dVar3 = *pvVar14;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000018,local_98)
      ;
      *pvVar14 = dVar16 * dVar1 + dVar2 * dVar3;
    }
    std::swap<double,std::allocator<double>>
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
    for (local_a8 = 0; local_a8 < local_48; local_a8 = local_a8 + 1) {
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,0);
      dVar16 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_30,local_a8);
      dVar1 = *pvVar14;
      pdVar12 = boost::array<double,_2UL>::operator[](&local_58,1);
      dVar2 = *pdVar12;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                          (local_30,local_a8 ^ (long)(1 << (bVar15 & 0x1f)));
      dVar3 = *pvVar14;
      pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000018,local_a8)
      ;
      *pvVar14 = dVar16 * dVar1 + dVar2 * dVar3;
    }
    std::swap<double,std::allocator<double>>
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
  }
  local_b8 = 0.0;
  for (local_c0 = 0; local_c0 < local_48; local_c0 = local_c0 + 1) {
    pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_30,local_c0);
    dVar16 = *pvVar14;
    pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_30,local_c0);
    local_b8 = dVar16 * *pvVar14 + local_b8;
  }
  dVar16 = sqrt(local_b8);
  peVar19 = (exp_number<double> *)(1.0 / dVar16);
  for (local_d0 = 0; local_d0 < local_48; local_d0 = local_d0 + 1) {
    in_stack_fffffffffffffdc0 = peVar19;
    pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_40,local_d0);
    *pvVar14 = (double)in_stack_fffffffffffffdc0 * *pvVar14;
    in_stack_fffffffffffffdc8 = peVar19;
    pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_38,local_d0);
    *pvVar14 = (double)in_stack_fffffffffffffdc8 * *pvVar14;
    pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000010,local_d0);
    *pvVar14 = (double)peVar19 * *pvVar14;
    pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000008,local_d0);
    *pvVar14 = (double)peVar19 * *pvVar14;
    pvVar14 = std::vector<double,_std::allocator<double>_>::operator[](local_30,local_d0);
    *pvVar14 = (double)peVar19 * *pvVar14;
  }
  eVar20 = standards::operator/(in_stack_fffffffffffffdc8,(double)in_stack_fffffffffffffdc0);
  eVar21.log_ = eVar20.log_;
  eVar21._8_8_ = in_RDI;
  return eVar21;
}

Assistant:

static exp_number product_U(uint_t Ly, real_t Jx, real_t beta,
                              exp_number factor, std::vector<real_t> &v,
                              std::vector<real_t> &v_10,
                              std::vector<real_t> &v_20,
                              std::vector<real_t> &v_01,
                              std::vector<real_t> &v_02,
                              std::vector<real_t> &vt) {
    uint_t dim = 1 << Ly;
    boost::array<double, 2> weight;
    weight[0] = std::exp(beta * Jx);
    weight[1] = std::exp(-beta * Jx);
    for (uint_t s = 0; s < Ly; ++s) {
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * Jx * (weight[0] * v[c0] + weight[1] * v[c1]) +
                 2 * Jx * (weight[0] * v_10[c0] - weight[1] * v_10[c1]) +
                 (weight[0] * v_20[c0] + weight[1] * v_20[c1]);
      }
      std::swap(v_20, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * (weight[0] * v[c0] - weight[1] * v[c1]) +
                 (weight[0] * v_10[c0] + weight[1] * v_10[c1]);
      }
      std::swap(v_10, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_02[c0] + weight[1] * v_02[c1]);
      }
      std::swap(v_02, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_01[c0] + weight[1] * v_01[c1]);
      }
      std::swap(v_01, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = weight[0] * v[c0] + weight[1] * v[c1];
      }
      std::swap(v, vt);
    }
    real_t norm2 = 0;
    for (uint_t c = 0; c < dim; ++c) {
      norm2 += v[c] * v[c];
    }
    real_t norm_inv = 1 / std::sqrt(norm2);
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] *= norm_inv;
      v_10[c] *= norm_inv;
      v_02[c] *= norm_inv;
      v_01[c] *= norm_inv;
      v[c] *= norm_inv;
    }
    return factor / norm_inv;
  }